

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

_Bool imap_is_bchar(char ch)

{
  uint uVar1;
  
  if ((9 < (byte)(ch - 0x30U)) && (0x19 < (byte)((ch & 0xdfU) + 0xbf))) {
    uVar1 = (int)ch - 0x21;
    if (((0x3e < uVar1) || ((0x4000000092007ff9U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
       (ch != 0x7e)) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool imap_is_bchar(char ch)
{
  /* Performing the alnum check with this macro is faster because of ASCII
     arithmetic */
  if(ISALNUM(ch))
    return TRUE;

  switch(ch) {
    /* bchar */
    case ':': case '@': case '/':
    /* bchar -> achar */
    case '&': case '=':
    /* bchar -> achar -> uchar -> unreserved (without alphanumeric) */
    case '-': case '.': case '_': case '~':
    /* bchar -> achar -> uchar -> sub-delims-sh */
    case '!': case '$': case '\'': case '(': case ')': case '*':
    case '+': case ',':
    /* bchar -> achar -> uchar -> pct-encoded */
    case '%': /* HEXDIG chars are already included above */
      return TRUE;

    default:
      return FALSE;
  }
}